

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O2

SQChar * sqstd_rex_matchnode(SQRex *exp,SQRexNode *node,SQChar *str,SQRexNode *next)

{
  ulong uVar1;
  char c;
  SQRexMatch *pSVar2;
  int iVar3;
  int iVar4;
  SQBool SVar5;
  SQChar *str_00;
  SQChar *pSVar6;
  SQChar *pSVar7;
  SQRexNode *pSVar8;
  ulong uVar9;
  SQRexNode *pSVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  
  iVar3 = node->type;
  switch(iVar3) {
  case 0x100:
    uVar14 = node->right & 0xffff;
    uVar9 = (ulong)node->right >> 0x10 & 0xffff;
    pSVar8 = next;
    if (node->next != -1) {
      pSVar8 = exp->_nodes + node->next;
    }
    uVar12 = 1;
    uVar15 = 0;
    do {
      uVar1 = uVar12 - 1;
      pSVar7 = str;
      uVar16 = uVar1;
      if ((uVar14 <= uVar1 && uVar12 != 0x10000) ||
         (str_00 = sqstd_rex_matchnode(exp,exp->_nodes + node->left,str,pSVar8), uVar16 = uVar15,
         str_00 == (SQChar *)0x0)) break;
      pSVar7 = str_00;
      if ((pSVar8 != (SQRexNode *)0x0) &&
         ((pSVar8->type != 0x100 || (*(short *)((long)&pSVar8->right + 2) != 0)))) {
        lVar13 = pSVar8->next;
        if ((lVar13 == -1) && ((next == (SQRexNode *)0x0 || (lVar13 = next->next, lVar13 == -1)))) {
          pSVar10 = (SQRexNode *)0x0;
        }
        else {
          pSVar10 = exp->_nodes + lVar13;
        }
        pSVar6 = sqstd_rex_matchnode(exp,pSVar8,str_00,pSVar10);
        if (pSVar6 != (SQChar *)0x0) {
          uVar16 = uVar9;
          if (uVar9 == uVar12 && uVar9 == uVar14) break;
          if ((uVar9 <= uVar12) && (uVar16 = uVar12, uVar14 == 0xffff || uVar1 < uVar14)) break;
        }
      }
      uVar12 = uVar12 + 1;
      uVar16 = uVar15 + 1;
      str = str_00;
      uVar15 = uVar16;
    } while (str_00 < exp->_eol);
    if ((uVar9 != uVar16 || uVar9 != uVar14) && ((long)uVar16 < (long)uVar9 || uVar14 != 0xffff)) {
      if ((long)uVar14 < (long)uVar16) {
        pSVar7 = (SQChar *)0x0;
      }
      if ((long)uVar16 < (long)uVar9) {
        pSVar7 = (SQChar *)0x0;
      }
    }
    break;
  case 0x101:
    pSVar8 = exp->_nodes + node->left;
    pSVar7 = str;
    while (pSVar7 = sqstd_rex_matchnode(exp,pSVar8,pSVar7,(SQRexNode *)0x0), pSVar7 != (SQChar *)0x0
          ) {
      if (pSVar8->next == -1) {
        return pSVar7;
      }
      pSVar8 = exp->_nodes + pSVar8->next;
    }
    for (pSVar8 = exp->_nodes + node->right;
        (str = sqstd_rex_matchnode(exp,pSVar8,str,(SQRexNode *)0x0), pSVar7 = (SQChar *)0x0,
        str != (SQChar *)0x0 && (pSVar7 = str, pSVar8->next != -1));
        pSVar8 = exp->_nodes + pSVar8->next) {
    }
    break;
  case 0x102:
  case 0x103:
    pSVar8 = exp->_nodes;
    lVar13 = node->left;
    if (iVar3 == 0x103) {
      lVar17 = exp->_currsubexp;
      lVar18 = -1;
    }
    else {
      lVar18 = node->right;
      lVar17 = exp->_currsubexp;
      if (lVar18 == lVar17) {
        exp->_matches[lVar18].begin = str;
        lVar17 = lVar18 + 1;
        exp->_currsubexp = lVar17;
      }
      else {
        lVar18 = -1;
      }
    }
    pSVar10 = pSVar8 + lVar13;
    do {
      pSVar8 = pSVar8 + pSVar10->next;
      if (pSVar10->next == -1) {
        pSVar8 = next;
      }
      str = sqstd_rex_matchnode(exp,pSVar10,str,pSVar8);
      if (str == (SQChar *)0x0) {
        if (lVar18 != -1) {
          pSVar2 = exp->_matches;
          pSVar2[lVar18].begin = (SQChar *)0x0;
          pSVar2[lVar18].len = 0;
        }
        goto LAB_00130b9d;
      }
      if (pSVar10->next == -1) break;
      pSVar8 = exp->_nodes;
      pSVar10 = pSVar8 + pSVar10->next;
    } while (pSVar8 != (SQRexNode *)0x0);
    exp->_currsubexp = lVar17;
    pSVar7 = str;
    if (lVar18 != -1) {
      exp->_matches[lVar18].len = (long)str - (long)exp->_matches[lVar18].begin;
    }
    break;
  case 0x104:
    pSVar7 = (SQChar *)0x0;
    if (exp->_eol != str) {
      pSVar7 = str + 1;
    }
    break;
  case 0x105:
  case 0x107:
    if (exp->_eol != str) {
      pSVar8 = exp->_nodes;
      lVar13 = node->left;
      c = *str;
      do {
        iVar4 = pSVar8[lVar13].type;
        if (iVar4 == 0x106) {
          SVar5 = sqstd_rex_matchcclass(pSVar8[lVar13].left,c);
          if (SVar5 != 0) goto LAB_00130abd;
        }
        else if (iVar4 == 0x108) {
          if ((pSVar8[lVar13].left <= (long)c) && ((long)c <= pSVar8[lVar13].right)) {
LAB_00130abd:
            iVar4 = 0x105;
            goto LAB_00130ac2;
          }
        }
        else if (iVar4 == c) goto LAB_00130abd;
        iVar4 = 0x107;
        if ((pSVar8 == (SQRexNode *)0x0) || (lVar13 = pSVar8[lVar13].next, lVar13 == -1))
        goto LAB_00130ac2;
      } while( true );
    }
    goto LAB_00130b9d;
  case 0x106:
    if (exp->_eol != str) {
      pSVar7 = (SQChar *)sqstd_rex_matchcclass(node->left,*str);
      str = str + 1;
      bVar19 = pSVar7 == (SQChar *)0x0;
LAB_00130ba9:
      if (!bVar19) {
        return str;
      }
      return pSVar7;
    }
    goto LAB_00130b9d;
  default:
    if (exp->_eol != str) {
      iVar4 = (int)*str;
LAB_00130ac2:
      str = str + 1;
      bVar19 = iVar3 == iVar4;
      goto LAB_00130aca;
    }
    goto LAB_00130b9d;
  case 0x10a:
    bVar19 = exp->_eol == str;
    goto LAB_00130aca;
  case 0x10b:
    bVar19 = exp->_bol == str;
    goto LAB_00130aca;
  case 0x10c:
    if (((exp->_bol != str) || (iVar3 = isspace((int)*str), iVar3 != 0)) &&
       ((exp->_eol != str || (iVar3 = isspace((int)str[-1]), iVar3 != 0)))) {
      iVar3 = isspace((int)*str);
      iVar4 = isspace((int)str[1]);
      if ((iVar3 == 0) == (iVar4 == 0)) {
        pSVar7 = (SQChar *)0x0;
        bVar19 = node->left == 0x62;
        goto LAB_00130ba9;
      }
    }
    bVar19 = node->left == 0x62;
LAB_00130aca:
    pSVar7 = (SQChar *)0x0;
    if (bVar19) {
      pSVar7 = str;
    }
    break;
  case 0x10d:
    if (node->left == (long)*str) {
      pcVar11 = str + 1;
      lVar13 = 1;
      do {
        if (exp->_eol <= pcVar11) {
          return (SQChar *)0x0;
        }
        if (node->right == (long)*pcVar11) {
          lVar13 = lVar13 + -1;
          if (lVar13 == 0) {
            return pcVar11 + 1;
          }
        }
        else {
          lVar13 = lVar13 + (ulong)(node->left == (long)*pcVar11);
        }
        pcVar11 = pcVar11 + 1;
      } while( true );
    }
LAB_00130b9d:
    pSVar7 = (SQChar *)0x0;
  }
  return pSVar7;
}

Assistant:

static const SQChar *sqstd_rex_matchnode(SQRex* exp,SQRexNode *node,const SQChar *str,SQRexNode *next)
{

    SQRexNodeType type = node->type;
    switch(type) {
    case OP_GREEDY: {
        //SQRexNode *greedystop = (node->next != -1) ? &exp->_nodes[node->next] : NULL;
        SQRexNode *greedystop = NULL;
        SQInteger p0 = (node->right >> 16)&0x0000FFFF, p1 = node->right&0x0000FFFF, nmaches = 0;
        const SQChar *s=str, *good = str;

        if(node->next != -1) {
            greedystop = &exp->_nodes[node->next];
        }
        else {
            greedystop = next;
        }

        while((nmaches == 0xFFFF || nmaches < p1)) {

            const SQChar *stop;
            if(!(s = sqstd_rex_matchnode(exp,&exp->_nodes[node->left],s,greedystop)))
                break;
            nmaches++;
            good=s;
            if(greedystop) {
                //checks that 0 matches satisfy the expression(if so skips)
                //if not would always stop(for instance if is a '?')
                if(greedystop->type != OP_GREEDY ||
                (greedystop->type == OP_GREEDY && ((greedystop->right >> 16)&0x0000FFFF) != 0))
                {
                    SQRexNode *gnext = NULL;
                    if(greedystop->next != -1) {
                        gnext = &exp->_nodes[greedystop->next];
                    }else if(next && next->next != -1){
                        gnext = &exp->_nodes[next->next];
                    }
                    stop = sqstd_rex_matchnode(exp,greedystop,s,gnext);
                    if(stop) {
                        //if satisfied stop it
                        if(p0 == p1 && p0 == nmaches) break;
                        else if(nmaches >= p0 && p1 == 0xFFFF) break;
                        else if(nmaches >= p0 && nmaches <= p1) break;
                    }
                }
            }

            if(s >= exp->_eol)
                break;
        }
        if(p0 == p1 && p0 == nmaches) return good;
        else if(nmaches >= p0 && p1 == 0xFFFF) return good;
        else if(nmaches >= p0 && nmaches <= p1) return good;
        return NULL;
    }
    case OP_OR: {
            const SQChar *asd = str;
            SQRexNode *temp=&exp->_nodes[node->left];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            asd = str;
            temp = &exp->_nodes[node->right];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            return NULL;
            break;
    }
    case OP_EXPR:
    case OP_NOCAPEXPR:{
            SQRexNode *n = &exp->_nodes[node->left];
            const SQChar *cur = str;
            SQInteger capture = -1;
            if(node->type != OP_NOCAPEXPR && node->right == exp->_currsubexp) {
                capture = exp->_currsubexp;
                exp->_matches[capture].begin = cur;
                exp->_currsubexp++;
            }
            SQInteger tempcap = exp->_currsubexp;
            do {
                SQRexNode *subnext = NULL;
                if(n->next != -1) {
                    subnext = &exp->_nodes[n->next];
                }else {
                    subnext = next;
                }
                if(!(cur = sqstd_rex_matchnode(exp,n,cur,subnext))) {
                    if(capture != -1){
                        exp->_matches[capture].begin = 0;
                        exp->_matches[capture].len = 0;
                    }
                    return NULL;
                }
            } while((n->next != -1) && (n = &exp->_nodes[n->next]));

            exp->_currsubexp = tempcap;
            if(capture != -1)
                exp->_matches[capture].len = cur - exp->_matches[capture].begin;
            return cur;
    }
    case OP_WB:
        if((str == exp->_bol && !isspace(*str))
         || (str == exp->_eol && !isspace(*(str-1)))
         || (!isspace(*str) && isspace(*(str+1)))
         || (isspace(*str) && !isspace(*(str+1))) ) {
            return (node->left == 'b')?str:NULL;
        }
        return (node->left == 'b')?NULL:str;
    case OP_BOL:
        if(str == exp->_bol) return str;
        return NULL;
    case OP_EOL:
        if(str == exp->_eol) return str;
        return NULL;
    case OP_DOT:{
        if (str == exp->_eol) return NULL;
        str++;
                }
        return str;
    case OP_NCLASS:
    case OP_CLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchclass(exp,&exp->_nodes[node->left],*str)?(type == OP_CLASS?SQTrue:SQFalse):(type == OP_NCLASS?SQTrue:SQFalse)) {
            str++;
            return str;
        }
        return NULL;
    case OP_CCLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchcclass(node->left,*str)) {
            str++;
            return str;
        }
        return NULL;
    case OP_MB:
        {
            SQInteger cb = node->left; //char that opens a balanced expression
            if(*str != cb) return NULL; // string doesnt start with open char
            SQInteger ce = node->right; //char that closes a balanced expression
            SQInteger cont = 1;
            const SQChar *streol = exp->_eol;
            while (++str < streol) {
              if (*str == ce) {
                if (--cont == 0) {
                    return ++str;
                }
              }
              else if (*str == cb) cont++;
            }
        }
        return NULL; // string ends out of balance
    default: /* char */
        if (str == exp->_eol) return NULL;
        if(*str != node->type) return NULL;
        str++;
        return str;
    }
    return NULL;
}